

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O3

string * anon_unknown.dwarf_51a6a::getFuncName
                   (string *__return_storage_ptr__,string *name,size_t numArgs)

{
  ostream *poVar1;
  string *psVar2;
  size_t sVar3;
  stringstream stream;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  if (numArgs != 0) {
    sVar3 = 0;
    do {
      if (sVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"x",1);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      sVar3 = sVar3 + 1;
    } while (numArgs != sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string getFuncName(std::string name, std::size_t numArgs) {
		std::stringstream stream;

		stream << name << "(";
		for (std::size_t i = 0; i < numArgs; i++) {
			if (i != 0) {
				stream << ", ";
			}

			stream << "x" << i;
		}

		stream << ")";

		return stream.str();
	}